

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O0

void __thiscall
enact::CastExpr::CastExpr
          (CastExpr *this,unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *expr,
          unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *typename_,
          Token *oper)

{
  Token *oper_local;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *typename__local;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *expr_local;
  CastExpr *this_local;
  
  Expr::Expr(&this->super_Expr);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__CastExpr_0016a5b8;
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::unique_ptr(&this->expr,expr);
  std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::unique_ptr
            (&this->typename_,typename_);
  Token::Token(&this->oper,oper);
  return;
}

Assistant:

CastExpr(std::unique_ptr<Expr> expr, std::unique_ptr<const Typename> typename_, Token oper) :
                expr{std::move(expr)},
                typename_{std::move(typename_)},
                oper{std::move(oper)} {}